

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_extensions.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBExtensionsInit(ClientContext *context,TableFunctionInitInput *input)

{
  key_type *__k;
  _Hash_node_base *this;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *pvVar1;
  _Head_base<0UL,_duckdb::DuckDBExtensionsData_*,_false> _Var2;
  char *pcVar3;
  int iVar4;
  idx_t iVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInfo>_>_>
  *puVar8;
  iterator iVar9;
  pointer pEVar10;
  pointer pDVar11;
  _Base_ptr p_Var12;
  ClientContext *extraout_RDX;
  ClientContext *extraout_RDX_00;
  ClientContext *extraout_RDX_01;
  ClientContext *extraout_RDX_02;
  ClientContext *extraout_RDX_03;
  ClientContext *extraout_RDX_04;
  ClientContext *context_00;
  _Hash_node_base *p_Var13;
  idx_t index;
  idx_t index_00;
  templated_unique_single_t result;
  ExtensionAlias alias;
  string ext_directory;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>_>
  installed_extensions;
  DefaultExtension extension;
  _Head_base<0UL,_duckdb::DuckDBExtensionsData_*,_false> local_190;
  ExtensionAlias local_188;
  pointer local_178;
  code *pcStack_170;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> local_168;
  idx_t local_160;
  key_type local_158;
  short local_138;
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120 [16];
  ExtensionInstallMode local_110;
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  char *local_e0;
  undefined1 local_d8 [16];
  pointer local_c8;
  pointer pVStack_c0;
  pointer local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  DatabaseInstance *local_90;
  FileSystem *local_88;
  TableFunctionInitInput *local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>_>
  local_78;
  DefaultExtension local_48;
  
  local_168._M_head_impl = (GlobalTableFunctionState *)context;
  local_190._M_head_impl = (DuckDBExtensionsData *)operator_new(0x28);
  ((local_190._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__DuckDBExtensionsData_02488550;
  ((local_190._M_head_impl)->entries).
  super_vector<duckdb::ExtensionInformation,_std::allocator<duckdb::ExtensionInformation>_>.
  super__Vector_base<duckdb::ExtensionInformation,_std::allocator<duckdb::ExtensionInformation>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_190._M_head_impl)->entries).
  super_vector<duckdb::ExtensionInformation,_std::allocator<duckdb::ExtensionInformation>_>.
  super__Vector_base<duckdb::ExtensionInformation,_std::allocator<duckdb::ExtensionInformation>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_190._M_head_impl)->entries).
  super_vector<duckdb::ExtensionInformation,_std::allocator<duckdb::ExtensionInformation>_>.
  super__Vector_base<duckdb::ExtensionInformation,_std::allocator<duckdb::ExtensionInformation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_190._M_head_impl)->offset = 0;
  local_88 = FileSystem::GetFileSystem((ClientContext *)input);
  local_90 = DatabaseInstance::GetDatabase((ClientContext *)input);
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  local_160 = ExtensionHelper::DefaultExtensionCount();
  iVar5 = ExtensionHelper::ExtensionAliasCount();
  context_00 = extraout_RDX;
  if (local_160 != 0) {
    index_00 = 0;
    local_80 = input;
    do {
      ExtensionHelper::GetDefaultExtension(&local_48,index_00);
      pcVar7 = local_48.name;
      local_158._M_string_length = 0;
      local_158.field_2._M_local_buf[0] = '\0';
      local_138 = 0;
      local_128 = 0;
      local_120[0] = 0;
      local_108 = local_f8;
      local_100 = 0;
      local_f8[0] = 0;
      local_e8 = local_d8;
      local_e0 = (char *)0x0;
      local_d8[0] = 0;
      local_b8 = (pointer)0x0;
      local_c8 = (pointer)0x0;
      pVStack_c0 = (pointer)0x0;
      local_b0 = local_a0;
      local_a8 = 0;
      local_a0[0] = 0;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      local_130 = local_120;
      strlen(local_48.name);
      ::std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,(ulong)pcVar7);
      local_138 = (ushort)local_48.statically_loaded << 8;
      if (local_48.statically_loaded == true) {
        local_188.alias = (char *)&local_178;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"(BUILT-IN)","");
      }
      else {
        local_188.extension = (char *)0x0;
        local_188.alias = (char *)&local_178;
        local_178 = (pointer)((ulong)local_178 & 0xffffffffffffff00);
      }
      ::std::__cxx11::string::operator=((string *)&local_130,(string *)&local_188);
      if ((pointer *)local_188.alias != &local_178) {
        operator_delete(local_188.alias);
      }
      pcVar3 = local_48.description;
      pcVar7 = local_e0;
      local_110 = NOT_INSTALLED - local_48.statically_loaded;
      strlen(local_48.description);
      ::std::__cxx11::string::_M_replace((ulong)&local_e8,0,pcVar7,(ulong)pcVar3);
      if (iVar5 != 0) {
        index = 0;
        do {
          local_188 = ExtensionHelper::GetExtensionAlias(index);
          iVar4 = ::std::__cxx11::string::compare((char *)&local_158);
          if (iVar4 == 0) {
            ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::emplace_back<char_const*&>
                      ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_c8,
                       &local_188.alias);
          }
          index = index + 1;
        } while (iVar5 != index);
      }
      pmVar6 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>_>
                             *)&local_78,&local_158);
      ::std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_158);
      pmVar6->loaded = (bool)(undefined1)local_138;
      pmVar6->installed = (bool)local_138._1_1_;
      ::std::__cxx11::string::operator=((string *)&pmVar6->file_path,(string *)&local_130);
      pmVar6->install_mode = local_110;
      ::std::__cxx11::string::operator=((string *)&pmVar6->installed_from,(string *)&local_108);
      ::std::__cxx11::string::operator=((string *)&pmVar6->description,(string *)&local_e8);
      pvVar1 = &(pmVar6->aliases).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>;
      local_188.alias =
           (char *)(pvVar1->super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   _M_impl.super__Vector_impl_data._M_start;
      local_188.extension =
           (char *)(pvVar1->super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
      local_178 = (pmVar6->aliases).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      (pmVar6->aliases).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = local_c8;
      (pmVar6->aliases).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = pVStack_c0;
      (pmVar6->aliases).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_b8;
      local_c8 = (pointer)0x0;
      pVStack_c0 = (pointer)0x0;
      local_b8 = (pointer)0x0;
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_188);
      ::std::__cxx11::string::operator=((string *)&pmVar6->extension_version,(string *)&local_b0);
      if (local_b0 != local_a0) {
        operator_delete(local_b0);
      }
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_c8);
      input = local_80;
      context_00 = extraout_RDX_00;
      if (local_e8 != local_d8) {
        operator_delete(local_e8);
        context_00 = extraout_RDX_01;
      }
      if (local_108 != local_f8) {
        operator_delete(local_108);
        context_00 = extraout_RDX_02;
      }
      if (local_130 != local_120) {
        operator_delete(local_130);
        context_00 = extraout_RDX_03;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
        context_00 = extraout_RDX_04;
      }
      index_00 = index_00 + 1;
    } while (index_00 != local_160);
  }
  ExtensionHelper::GetExtensionDirectoryPath_abi_cxx11_
            (&local_158,(ExtensionHelper *)input,context_00);
  local_178 = (pointer)0x0;
  pcStack_170 = (code *)0x0;
  local_188 = (ExtensionAlias)ZEXT816(0);
  pcVar7 = (char *)operator_new(0x18);
  *(FileSystem **)pcVar7 = local_88;
  *(string **)(pcVar7 + 8) = &local_158;
  *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>_>
    **)(pcVar7 + 0x10) = &local_78;
  local_188.alias = pcVar7;
  pcStack_170 = ::std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_extensions.cpp:101:30)>
                ::_M_invoke;
  local_178 = (pointer)::std::
                       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_extensions.cpp:101:30)>
                       ::_M_manager;
  (*local_88->_vptr_FileSystem[0x11])(local_88,&local_158,&local_188,0);
  if (local_178 != (pointer)0x0) {
    (*(code *)local_178)(&local_188,&local_188,3);
  }
  puVar8 = DatabaseInstance::GetExtensions_abi_cxx11_(local_90);
  p_Var13 = (puVar8->_M_h)._M_before_begin._M_nxt;
  if (p_Var13 != (_Hash_node_base *)0x0) {
    do {
      if (*(char *)&p_Var13[5]._M_nxt == '\x01') {
        __k = (key_type *)(p_Var13 + 1);
        if (p_Var13[6]._M_nxt != (_Hash_node_base *)0x0) {
          iVar9 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>_>
                  ::find(&local_78,__k);
          this = p_Var13 + 6;
          if (((_Rb_tree_header *)iVar9._M_node == &local_78._M_impl.super__Rb_tree_header) ||
             (*(byte *)((long)&iVar9._M_node[3]._M_color + 1) == 0)) {
            pmVar6 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>_>
                                   *)&local_78,__k);
            ::std::__cxx11::string::_M_assign((string *)pmVar6);
            pmVar6->loaded = true;
            unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
            ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                          *)this);
            ::std::__cxx11::string::_M_assign((string *)&pmVar6->extension_version);
            pEVar10 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                      ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                                    *)this);
            pmVar6->installed = pEVar10->mode == STATICALLY_LINKED;
            pEVar10 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                      ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                                    *)this);
            pmVar6->install_mode = pEVar10->mode;
            pEVar10 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                      ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                                    *)this);
            if ((pEVar10->mode == STATICALLY_LINKED) && ((pmVar6->file_path)._M_string_length == 0))
            {
              ::std::__cxx11::string::_M_replace((ulong)&pmVar6->file_path,0,(char *)0x0,0x1de50a6);
            }
          }
          else {
            *(undefined1 *)&iVar9._M_node[3]._M_color = _S_black;
            unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
            ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                          *)this);
            ::std::__cxx11::string::_M_assign((string *)&iVar9._M_node[7]._M_parent);
          }
        }
        if (p_Var13[7]._M_nxt != (_Hash_node_base *)0x0) {
          iVar9 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>_>
                  ::find(&local_78,__k);
          if ((_Rb_tree_header *)iVar9._M_node != &local_78._M_impl.super__Rb_tree_header) {
            unique_ptr<duckdb::ExtensionLoadedInfo,_std::default_delete<duckdb::ExtensionLoadedInfo>,_true>
            ::operator->((unique_ptr<duckdb::ExtensionLoadedInfo,_std::default_delete<duckdb::ExtensionLoadedInfo>,_true>
                          *)(p_Var13 + 7));
            ::std::__cxx11::string::_M_assign((string *)&iVar9._M_node[5]._M_left);
          }
        }
      }
      p_Var13 = p_Var13->_M_nxt;
    } while (p_Var13 != (_Hash_node_base *)0x0);
  }
  pDVar11 = unique_ptr<duckdb::DuckDBExtensionsData,_std::default_delete<duckdb::DuckDBExtensionsData>,_true>
            ::operator->((unique_ptr<duckdb::DuckDBExtensionsData,_std::default_delete<duckdb::DuckDBExtensionsData>,_true>
                          *)&local_190);
  ::std::vector<duckdb::ExtensionInformation,_std::allocator<duckdb::ExtensionInformation>_>::
  reserve(&(pDVar11->entries).
           super_vector<duckdb::ExtensionInformation,_std::allocator<duckdb::ExtensionInformation>_>
          ,local_78._M_impl.super__Rb_tree_header._M_node_count);
  if ((_Rb_tree_header *)local_78._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_78._M_impl.super__Rb_tree_header) {
    p_Var12 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pDVar11 = unique_ptr<duckdb::DuckDBExtensionsData,_std::default_delete<duckdb::DuckDBExtensionsData>,_true>
                ::operator->((unique_ptr<duckdb::DuckDBExtensionsData,_std::default_delete<duckdb::DuckDBExtensionsData>,_true>
                              *)&local_190);
      ::std::vector<duckdb::ExtensionInformation,_std::allocator<duckdb::ExtensionInformation>_>::
      emplace_back<duckdb::ExtensionInformation>
                (&(pDVar11->entries).
                  super_vector<duckdb::ExtensionInformation,_std::allocator<duckdb::ExtensionInformation>_>
                 ,(ExtensionInformation *)(p_Var12 + 2));
      p_Var12 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != &local_78._M_impl.super__Rb_tree_header);
  }
  _Var2._M_head_impl = local_190._M_head_impl;
  local_190._M_head_impl = (DuckDBExtensionsData *)0x0;
  (local_168._M_head_impl)->_vptr_GlobalTableFunctionState = (_func_int **)_Var2._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionInformation>_>_>
  ::~_Rb_tree(&local_78);
  if (local_190._M_head_impl != (DuckDBExtensionsData *)0x0) {
    (*((local_190._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState[1])
              ();
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(_Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )local_168._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBExtensionsInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBExtensionsData>();

	auto &fs = FileSystem::GetFileSystem(context);
	auto &db = DatabaseInstance::GetDatabase(context);

	// Firstly, we go over all Default Extensions: duckdb_extensions always prints those, installed/loaded or not
	map<string, ExtensionInformation> installed_extensions;
	auto extension_count = ExtensionHelper::DefaultExtensionCount();
	auto alias_count = ExtensionHelper::ExtensionAliasCount();
	for (idx_t i = 0; i < extension_count; i++) {
		auto extension = ExtensionHelper::GetDefaultExtension(i);
		ExtensionInformation info;
		info.name = extension.name;
		info.installed = extension.statically_loaded;
		info.loaded = false;
		info.file_path = extension.statically_loaded ? "(BUILT-IN)" : string();
		info.install_mode =
		    extension.statically_loaded ? ExtensionInstallMode::STATICALLY_LINKED : ExtensionInstallMode::NOT_INSTALLED;
		info.description = extension.description;
		for (idx_t k = 0; k < alias_count; k++) {
			auto alias = ExtensionHelper::GetExtensionAlias(k);
			if (info.name == alias.extension) {
				info.aliases.emplace_back(alias.alias);
			}
		}
		installed_extensions[info.name] = std::move(info);
	}

	// Secondly we scan all installed extensions and their install info
#ifndef WASM_LOADABLE_EXTENSIONS
	auto ext_directory = ExtensionHelper::GetExtensionDirectoryPath(context);
	fs.ListFiles(ext_directory, [&](const string &path, bool is_directory) {
		if (!StringUtil::EndsWith(path, ".duckdb_extension")) {
			return;
		}
		ExtensionInformation info;
		info.name = fs.ExtractBaseName(path);
		info.installed = true;
		info.loaded = false;
		info.file_path = fs.JoinPath(ext_directory, path);

		// Check the info file for its installation source
		auto info_file_path = fs.JoinPath(ext_directory, path + ".info");

		// Read the info file
		auto extension_install_info = ExtensionInstallInfo::TryReadInfoFile(fs, info_file_path, info.name);
		info.install_mode = extension_install_info->mode;
		info.extension_version = extension_install_info->version;
		if (extension_install_info->mode == ExtensionInstallMode::REPOSITORY) {
			info.installed_from = ExtensionRepository::GetRepository(extension_install_info->repository_url);
		} else {
			info.installed_from = extension_install_info->full_path;
		}

		auto entry = installed_extensions.find(info.name);
		if (entry == installed_extensions.end()) {
			installed_extensions[info.name] = std::move(info);
		} else {
			if (entry->second.install_mode != ExtensionInstallMode::STATICALLY_LINKED) {
				entry->second.file_path = info.file_path;
				entry->second.install_mode = info.install_mode;
				entry->second.installed_from = info.installed_from;
				entry->second.install_mode = info.install_mode;
				entry->second.extension_version = info.extension_version;
			}
			entry->second.installed = true;
		}
	});
#endif

	// Finally, we check the list of currently loaded extensions
	auto &extensions = db.GetExtensions();
	for (auto &e : extensions) {
		if (!e.second.is_loaded) {
			continue;
		}
		auto &ext_name = e.first;
		auto &ext_data = e.second;
		if (auto &ext_install_info = ext_data.install_info) {
			auto entry = installed_extensions.find(ext_name);
			if (entry == installed_extensions.end() || !entry->second.installed) {
				ExtensionInformation &info = installed_extensions[ext_name];

				info.name = ext_name;
				info.loaded = true;
				info.extension_version = ext_install_info->version;
				info.installed = ext_install_info->mode == ExtensionInstallMode::STATICALLY_LINKED;
				info.install_mode = ext_install_info->mode;
				if (ext_data.install_info->mode == ExtensionInstallMode::STATICALLY_LINKED && info.file_path.empty()) {
					info.file_path = "(BUILT-IN)";
				}
			} else {
				entry->second.loaded = true;
				entry->second.extension_version = ext_install_info->version;
			}
		}
		if (auto &ext_load_info = ext_data.load_info) {
			auto entry = installed_extensions.find(ext_name);
			if (entry != installed_extensions.end()) {
				entry->second.description = ext_load_info->description;
			}
		}
	}

	result->entries.reserve(installed_extensions.size());
	for (auto &kv : installed_extensions) {
		result->entries.push_back(std::move(kv.second));
	}
	return std::move(result);
}